

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O3

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  void *pvVar27;
  int ki;
  int iVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  int l;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  void *pvVar36;
  int iVar37;
  int iVar38;
  bool bVar39;
  float fVar40;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  ulong local_200;
  int local_1f4;
  int local_1e4;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1b8;
  allocator_type local_171;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  long local_150;
  ulong local_148;
  long local_140;
  ulong local_138;
  ulong local_130;
  Mat local_128;
  void *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  long local_98;
  vector<int,_std::allocator<int>_> local_90;
  Option local_78;
  
  uVar29 = bottom_blob->w;
  iVar14 = bottom_blob->h;
  iVar2 = bottom_blob->d;
  uVar11 = bottom_blob->c;
  uVar35 = (ulong)uVar11;
  sVar4 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    local_168 = uVar35;
    if (this->adaptive_pooling == 0) {
      local_128.cstep = 0;
      local_128.data = (void *)0x0;
      local_128.refcount._0_4_ = 0;
      local_128.refcount._4_4_ = 0;
      local_128.elemsize._0_4_ = 0;
      local_128.elemsize._4_4_ = 0;
      local_128.elempack = 0;
      local_128.allocator = (Allocator *)0x0;
      local_128.dims = 0;
      local_128.w = 0;
      local_128.h = 0;
      local_128.d = 0;
      local_128.c = 0;
      local_78.lightmode = opt->lightmode;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_ops = opt->use_subgroup_ops;
      local_78.use_reserved_0 = opt->use_reserved_0;
      local_78.num_threads = opt->num_threads;
      local_78.blob_allocator = opt->blob_allocator;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      uVar35._0_1_ = opt->use_bf16_storage;
      uVar35._1_1_ = opt->use_fp16_packed;
      uVar35._2_1_ = opt->use_fp16_storage;
      uVar35._3_1_ = opt->use_fp16_arithmetic;
      uVar35._4_1_ = opt->use_int8_packed;
      uVar35._5_1_ = opt->use_int8_storage;
      uVar35._6_1_ = opt->use_int8_arithmetic;
      uVar35._7_1_ = opt->use_packing_layout;
      local_78.vulkan_device_index = opt->vulkan_device_index;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_shader_local_memory = opt->use_shader_local_memory;
      local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
      local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
      local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
      local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
      local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
      local_78.use_fp16_uniform = opt->use_fp16_uniform;
      local_78.use_int8_uniform = opt->use_int8_uniform;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78._32_8_ = uVar35 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&local_128,&local_78);
      iVar2 = local_128.h;
      iVar14 = local_128.w;
      iVar21 = -100;
      if ((local_128.data != (void *)0x0) && ((long)local_128.c * local_128.cstep != 0)) {
        iVar3 = local_128.d;
        iVar9 = (local_128.w - this->kernel_w) / this->stride_w;
        uVar35 = (long)(local_128.h - this->kernel_h) / (long)this->stride_h;
        local_130 = uVar35 & 0xffffffff;
        uVar15 = iVar9 + 1;
        uVar24 = (int)uVar35 + 1;
        uVar35 = (long)(local_128.d - this->kernel_d) / (long)this->stride_d;
        local_160 = uVar35 & 0xffffffff;
        uVar29 = (int)uVar35 + 1;
        Mat::create(top_blob,uVar15,uVar24,uVar29,uVar11,sVar4,(Allocator *)0x0);
        iVar21 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar35 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_90,uVar35,&local_171);
          iVar21 = this->kernel_d;
          if (0 < iVar21) {
            iVar10 = this->kernel_w;
            iVar30 = this->kernel_h;
            iVar25 = iVar14 - iVar10;
            iVar13 = iVar2 - iVar30;
            iVar12 = 0;
            iVar28 = 0;
            iVar38 = 0;
            do {
              if (0 < iVar30) {
                iVar21 = 0;
                do {
                  if (0 < iVar10) {
                    lVar16 = 0;
                    do {
                      local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar38 + lVar16] = iVar28 + (int)lVar16;
                      iVar10 = this->kernel_w;
                      lVar16 = lVar16 + 1;
                      iVar37 = (int)lVar16;
                    } while (iVar37 < iVar10);
                    iVar38 = iVar38 + iVar37;
                    iVar30 = this->kernel_h;
                    iVar28 = iVar28 + iVar37;
                  }
                  iVar28 = iVar28 + iVar25;
                  iVar21 = iVar21 + 1;
                } while (iVar21 < iVar30);
                iVar21 = this->kernel_d;
              }
              iVar28 = iVar28 + iVar13 * iVar14;
              iVar12 = iVar12 + 1;
            } while (iVar12 < iVar21);
          }
          iVar21 = (int)uVar35;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              local_1f4 = 0;
              iVar21 = 0;
              local_1e4 = 0;
              if (this->pad_mode == 0) {
                local_1f4 = (bottom_blob->w - local_128.w) + this->pad_left + this->pad_right;
                iVar21 = (bottom_blob->h - local_128.h) + this->pad_top + this->pad_bottom;
                local_1e4 = (bottom_blob->d - local_128.d) + this->pad_front + this->pad_behind;
              }
              if (0 < (int)uVar11) {
                local_e0 = local_128.data;
                local_d0 = top_blob->data;
                local_d8 = top_blob->cstep * top_blob->elemsize;
                local_c0 = (long)this->stride_d;
                local_150 = (long)(int)uVar15;
                local_b0 = (ulong)uVar29;
                local_158 = (ulong)uVar24;
                local_148 = (ulong)uVar15;
                local_c8 = local_128.cstep *
                           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
                lVar16 = (long)local_128.w *
                         CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
                local_b8 = local_128.h * lVar16 * local_c0;
                local_138 = 0;
                do {
                  if (-1 < (int)local_160) {
                    local_1b8 = (void *)(local_d8 * local_138 + (long)local_d0);
                    local_98 = (long)this->stride_h;
                    pvVar36 = local_e0;
                    uVar35 = 0;
                    do {
                      local_a8 = uVar35;
                      local_a0 = pvVar36;
                      if (-1 < (int)local_130) {
                        iVar10 = this->stride_w;
                        uVar29 = this->kernel_d;
                        local_140 = (long)iVar10 * 4;
                        local_170 = 0;
                        local_1c8 = local_a0;
                        do {
                          if (-1 < iVar9) {
                            iVar30 = this->pad_front;
                            lVar20 = 0;
                            uVar35 = 0;
                            pvVar36 = local_1c8;
                            do {
                              fVar40 = NAN;
                              if (0 < (int)uVar29) {
                                fVar40 = 0.0;
                                uVar22 = 0;
                                iVar25 = 0;
                                pvVar19 = pvVar36;
                                do {
                                  lVar23 = local_a8 * local_c0 + uVar22;
                                  if (iVar30 <= lVar23) {
                                    if ((local_1e4 + iVar3) - this->pad_behind <= lVar23) break;
                                    if (0 < this->kernel_h) {
                                      uVar26 = 0;
                                      pvVar27 = pvVar19;
                                      do {
                                        lVar23 = uVar26 + local_170 * local_98;
                                        if (this->pad_top <= lVar23) {
                                          if ((iVar21 + iVar2) - this->pad_bottom <= lVar23) break;
                                          if (0 < this->kernel_w) {
                                            uVar17 = 0;
                                            do {
                                              if ((long)this->pad_left <= (long)(lVar20 + uVar17)) {
                                                if ((long)((local_1f4 + iVar14) - this->pad_right)
                                                    <= (long)(lVar20 + uVar17)) break;
                                                fVar40 = fVar40 + *(float *)((long)pvVar27 +
                                                                            uVar17 * 4);
                                                iVar25 = iVar25 + 1;
                                              }
                                              uVar17 = uVar17 + 1;
                                            } while ((uint)this->kernel_w != uVar17);
                                          }
                                        }
                                        uVar26 = uVar26 + 1;
                                        pvVar27 = (void *)((long)pvVar27 + lVar16);
                                      } while (uVar26 != (uint)this->kernel_h);
                                    }
                                  }
                                  uVar22 = uVar22 + 1;
                                  pvVar19 = (void *)((long)pvVar19 + local_128.h * lVar16);
                                } while (uVar22 != uVar29);
                                fVar40 = fVar40 / (float)iVar25;
                              }
                              *(float *)((long)local_1b8 + uVar35 * 4) = fVar40;
                              uVar35 = uVar35 + 1;
                              pvVar36 = (void *)((long)pvVar36 + local_140);
                              lVar20 = lVar20 + iVar10;
                            } while (uVar35 != local_148);
                          }
                          local_1b8 = (void *)((long)local_1b8 + local_150 * 4);
                          local_170 = local_170 + 1;
                          local_1c8 = (void *)((long)local_1c8 + lVar16 * local_98);
                        } while (local_170 != local_158);
                      }
                      pvVar36 = (void *)((long)local_a0 + local_b8);
                      uVar35 = local_a8 + 1;
                    } while (local_a8 + 1 != local_b0);
                  }
                  local_138 = local_138 + 1;
                  local_e0 = (void *)((long)local_e0 + local_c8);
                } while (local_138 != local_168);
              }
            }
            else if (0 < (int)uVar11) {
              pvVar36 = top_blob->data;
              sVar4 = top_blob->cstep;
              sVar5 = top_blob->elemsize;
              lVar16 = (long)local_128.w *
                       CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
              local_200 = 0;
              do {
                if (-1 < (int)local_160) {
                  pvVar19 = (void *)(sVar4 * sVar5 * local_200 + (long)pvVar36);
                  iVar14 = 0;
                  do {
                    if (-1 < (int)local_130) {
                      iVar2 = this->stride_d;
                      iVar3 = this->stride_h;
                      iVar10 = this->stride_w;
                      uVar22 = 0;
                      do {
                        if (-1 < iVar9) {
                          uVar26 = 0;
                          do {
                            if (iVar21 < 1) {
                              fVar40 = 0.0;
                            }
                            else {
                              fVar40 = 0.0;
                              uVar17 = 0;
                              do {
                                fVar40 = fVar40 + *(float *)((long)local_128.data +
                                                            (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar17] *
                                                  4 + uVar26 * (long)iVar10 * 4 +
                                                      uVar22 * iVar3 * lVar16 +
                                                      (long)iVar14 * (long)iVar2 *
                                                      local_128.h * lVar16 +
                                                      local_128.cstep *
                                                      CONCAT44(local_128.elemsize._4_4_,
                                                               (undefined4)local_128.elemsize) *
                                                      local_200);
                                uVar17 = uVar17 + 1;
                              } while ((uVar35 & 0xffffffff) != uVar17);
                            }
                            *(float *)((long)pvVar19 + uVar26 * 4) = fVar40 * (1.0 / (float)iVar21);
                            uVar26 = uVar26 + 1;
                          } while (uVar26 != uVar15);
                        }
                        pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar15 * 4);
                        uVar22 = uVar22 + 1;
                      } while (uVar22 != uVar24);
                    }
                    bVar39 = iVar14 != (int)local_160;
                    iVar14 = iVar14 + 1;
                  } while (bVar39);
                }
                local_200 = local_200 + 1;
              } while (local_200 != local_168);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar11)) {
            sVar4 = top_blob->cstep;
            sVar5 = top_blob->elemsize;
            pvVar36 = top_blob->data;
            lVar16 = (long)local_128.w *
                     CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
            local_200 = 0;
            do {
              if (-1 < (int)local_160) {
                pvVar19 = (void *)(sVar4 * sVar5 * local_200 + (long)pvVar36);
                iVar14 = 0;
                do {
                  if (-1 < (int)local_130) {
                    iVar2 = this->stride_d;
                    iVar3 = this->stride_h;
                    iVar10 = this->stride_w;
                    uVar22 = 0;
                    do {
                      if (-1 < iVar9) {
                        lVar20 = uVar22 * iVar3 * lVar16 +
                                 (long)iVar14 * (long)iVar2 * local_128.h * lVar16 +
                                 local_128.cstep *
                                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) *
                                 local_200;
                        uVar26 = 0;
                        do {
                          lVar23 = uVar26 * (long)iVar10;
                          fVar40 = *(float *)((long)local_128.data + lVar23 * 4 + lVar20);
                          if (0 < iVar21) {
                            uVar17 = 0;
                            do {
                              fVar1 = *(float *)((long)local_128.data +
                                                (long)local_90.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar17] *
                                                4 + lVar23 * 4 + lVar20);
                              if (fVar40 <= fVar1) {
                                fVar40 = fVar1;
                              }
                              uVar17 = uVar17 + 1;
                            } while ((uVar35 & 0xffffffff) != uVar17);
                          }
                          *(float *)((long)pvVar19 + uVar26 * 4) = fVar40;
                          uVar26 = uVar26 + 1;
                        } while (uVar26 != uVar15);
                      }
                      pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar15 * 4);
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar24);
                  }
                  bVar39 = iVar14 != (int)local_160;
                  iVar14 = iVar14 + 1;
                } while (bVar39);
              }
              local_200 = local_200 + 1;
            } while (local_200 != local_168);
          }
          if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar21 = 0;
        }
      }
      piVar6 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            if (local_128.data != (void *)0x0) {
              free(local_128.data);
            }
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      uVar24 = this->out_w;
      if (this->out_w == 0xffffff17) {
        uVar24 = uVar29;
      }
      iVar9 = this->out_h;
      if (this->out_h == -0xe9) {
        iVar9 = iVar14;
      }
      iVar3 = this->out_d;
      if (this->out_d == -0xe9) {
        iVar3 = iVar2;
      }
      if (iVar3 == iVar2 && (iVar9 == iVar14 && uVar24 == uVar29)) {
        iVar21 = 0;
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar21 = 0;
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar14 = bottom_blob->w;
          iVar2 = bottom_blob->h;
          iVar9 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar14;
          top_blob->h = iVar2;
          top_blob->d = iVar9;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
      }
      else {
        Mat::create(top_blob,uVar24,iVar9,iVar3,uVar11,sVar4,opt->blob_allocator);
        pvVar36 = top_blob->data;
        iVar21 = -100;
        if ((pvVar36 != (void *)0x0) && (sVar4 = top_blob->cstep, (long)top_blob->c * sVar4 != 0)) {
          iVar21 = 0;
          if (this->pooling_type == 0) {
            if (0 < (int)uVar11) {
              pvVar19 = bottom_blob->data;
              sVar5 = bottom_blob->cstep;
              sVar7 = bottom_blob->elemsize;
              sVar8 = top_blob->elemsize;
              local_1c8 = (void *)0x0;
              do {
                if (0 < iVar3) {
                  lVar16 = sVar5 * sVar7 * (long)local_1c8;
                  local_1d8 = (void *)(sVar4 * sVar8 * (long)local_1c8 + (long)pvVar36);
                  iVar21 = 0;
                  do {
                    uVar35 = (long)(iVar21 * iVar2) / (long)iVar3;
                    iVar21 = iVar21 + 1;
                    uVar11 = (iVar21 * iVar2 + iVar3 + -1) / iVar3;
                    if (0 < iVar9) {
                      iVar30 = (int)uVar35;
                      iVar10 = 0;
                      do {
                        uVar22 = (long)(iVar10 * iVar14) / (long)iVar9;
                        iVar10 = iVar10 + 1;
                        uVar15 = (iVar10 * iVar14 + iVar9 + -1) / iVar9;
                        if (0 < (int)uVar24) {
                          iVar25 = (int)uVar22;
                          uVar26 = 0;
                          do {
                            uVar18 = uVar35 & 0xffffffff;
                            iVar13 = (int)(uVar29 * (int)uVar26) / (int)uVar24;
                            uVar17 = uVar26 + 1;
                            iVar12 = iVar13 + (iVar30 * iVar14 + iVar25) * uVar29;
                            fVar40 = *(float *)((long)pvVar19 + (long)iVar12 * 4 + lVar16);
                            if (iVar30 < (int)uVar11) {
                              iVar28 = (int)(uVar29 * (int)uVar17 + (uVar24 - 1)) / (int)uVar24;
                              do {
                                uVar34 = uVar22 & 0xffffffff;
                                iVar38 = iVar12;
                                if (iVar25 < (int)uVar15) {
                                  do {
                                    lVar20 = (long)iVar28 - (long)iVar13;
                                    iVar37 = iVar38;
                                    if (iVar13 < iVar28) {
                                      do {
                                        fVar1 = *(float *)((long)pvVar19 + (long)iVar37 * 4 + lVar16
                                                          );
                                        if (fVar40 <= fVar1) {
                                          fVar40 = fVar1;
                                        }
                                        iVar37 = iVar37 + 1;
                                        lVar20 = lVar20 + -1;
                                      } while (lVar20 != 0);
                                    }
                                    uVar33 = (int)uVar34 + 1;
                                    uVar34 = (ulong)uVar33;
                                    iVar38 = iVar38 + uVar29;
                                  } while (uVar33 != uVar15);
                                }
                                uVar33 = (int)uVar18 + 1;
                                uVar18 = (ulong)uVar33;
                                iVar12 = iVar12 + iVar14 * uVar29;
                              } while (uVar33 != uVar11);
                            }
                            *(float *)((long)local_1d8 + uVar26 * 4) = fVar40;
                            uVar26 = uVar17;
                          } while (uVar17 != uVar24);
                        }
                        local_1d8 = (void *)((long)local_1d8 + (long)(int)uVar24 * 4);
                      } while (iVar10 != iVar9);
                    }
                  } while (iVar21 != iVar3);
                }
                local_1c8 = (void *)((long)local_1c8 + 1);
                iVar21 = 0;
              } while (local_1c8 != (void *)local_168);
            }
          }
          else if ((this->pooling_type == 1) && (0 < (int)uVar11)) {
            pvVar19 = bottom_blob->data;
            sVar5 = bottom_blob->cstep;
            sVar7 = bottom_blob->elemsize;
            sVar8 = top_blob->elemsize;
            local_1c8 = (void *)0x0;
            do {
              if (0 < iVar3) {
                local_1d0 = (void *)(sVar4 * sVar8 * (long)local_1c8 + (long)pvVar36);
                iVar21 = 0;
                do {
                  iVar30 = (iVar21 * iVar2) / iVar3;
                  iVar21 = iVar21 + 1;
                  iVar10 = (iVar21 * iVar2 + iVar3 + -1) / iVar3;
                  if (0 < iVar9) {
                    iVar25 = 0;
                    do {
                      uVar35 = (long)(iVar25 * iVar14) / (long)iVar9;
                      iVar25 = iVar25 + 1;
                      uVar11 = (iVar25 * iVar14 + iVar9 + -1) / iVar9;
                      if (0 < (int)uVar24) {
                        iVar13 = (int)uVar35;
                        uVar22 = 0;
                        do {
                          iVar28 = (int)(uVar29 * (int)uVar22) / (int)uVar24;
                          uVar26 = uVar22 + 1;
                          iVar12 = (int)((int)uVar26 * uVar29 + (uVar24 - 1)) / (int)uVar24;
                          fVar40 = 0.0;
                          if (iVar30 < iVar10) {
                            iVar37 = (iVar14 * iVar30 + iVar13) * uVar29 + iVar28;
                            iVar38 = iVar30;
                            do {
                              uVar17 = uVar35 & 0xffffffff;
                              iVar32 = iVar37;
                              if (iVar13 < (int)uVar11) {
                                do {
                                  lVar16 = (long)iVar12 - (long)iVar28;
                                  iVar31 = iVar32;
                                  if (iVar28 < iVar12) {
                                    do {
                                      fVar40 = fVar40 + *(float *)((long)pvVar19 +
                                                                  (long)iVar31 * 4 +
                                                                  sVar5 * sVar7 * (long)local_1c8);
                                      iVar31 = iVar31 + 1;
                                      lVar16 = lVar16 + -1;
                                    } while (lVar16 != 0);
                                  }
                                  uVar15 = (int)uVar17 + 1;
                                  uVar17 = (ulong)uVar15;
                                  iVar32 = iVar32 + uVar29;
                                } while (uVar15 != uVar11);
                              }
                              iVar38 = iVar38 + 1;
                              iVar37 = iVar37 + iVar14 * uVar29;
                            } while (iVar38 != iVar10);
                          }
                          *(float *)((long)local_1d0 + uVar22 * 4) =
                               fVar40 / ((float)(iVar12 - iVar28) *
                                        (float)(int)(uVar11 - iVar13) * (float)(iVar10 - iVar30));
                          uVar22 = uVar26;
                        } while (uVar26 != uVar24);
                      }
                      local_1d0 = (void *)((long)local_1d0 + (long)(int)uVar24 * 4);
                    } while (iVar25 != iVar9);
                  }
                } while (iVar21 != iVar3);
              }
              local_1c8 = (void *)((long)local_1c8 + 1);
              iVar21 = 0;
            } while (local_1c8 != (void *)local_168);
          }
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar11,sVar4,opt->blob_allocator);
    pvVar36 = top_blob->data;
    iVar21 = -100;
    if ((pvVar36 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar29 = iVar14 * uVar29 * iVar2;
      if (this->pooling_type == 0) {
        if ((int)uVar11 < 1) {
          return 0;
        }
        lVar16 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar19 = bottom_blob->data;
        uVar22 = 0;
        pvVar27 = pvVar19;
        do {
          fVar40 = *(float *)((long)pvVar19 + lVar16 * uVar22);
          if (0 < (int)uVar29) {
            uVar26 = 0;
            do {
              fVar1 = *(float *)((long)pvVar27 + uVar26 * 4);
              if (fVar40 <= fVar1) {
                fVar40 = fVar1;
              }
              uVar26 = uVar26 + 1;
            } while (uVar29 != uVar26);
          }
          *(float *)((long)pvVar36 + uVar22 * 4) = fVar40;
          uVar22 = uVar22 + 1;
          pvVar27 = (void *)((long)pvVar27 + lVar16);
        } while (uVar22 != uVar35);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar11 < 1) {
          return 0;
        }
        sVar4 = bottom_blob->cstep;
        sVar5 = bottom_blob->elemsize;
        pvVar19 = bottom_blob->data;
        uVar22 = 0;
        do {
          fVar40 = 0.0;
          if (0 < (int)uVar29) {
            uVar26 = 0;
            do {
              fVar40 = fVar40 + *(float *)((long)pvVar19 + uVar26 * 4);
              uVar26 = uVar26 + 1;
            } while (uVar29 != uVar26);
          }
          *(float *)((long)pvVar36 + uVar22 * 4) = fVar40 * (1.0 / (float)(int)uVar29);
          uVar22 = uVar22 + 1;
          pvVar19 = (void *)((long)pvVar19 + sVar4 * sVar5);
        } while (uVar22 != uVar35);
      }
      iVar21 = 0;
    }
  }
  return iVar21;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;
        int _out_d = out_d == -233 ? d : out_d;

        if (_out_w == w && _out_h == h && _out_d == d)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, _out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < _out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / _out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + _out_d - 1) / _out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < _out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / _out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < _out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / _out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += _out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}